

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_q.c
# Opt level: O2

void test_option_q(void)

{
  wchar_t wVar1;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                      ,L'*',"foo",L'Ƥ',L'\xffffffff',"foo1");
  wVar1 = systemf("%s -cf archive.tar foo",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                      ,L',',0,"0",(long)wVar1,"systemf(\"%s -cf archive.tar foo\", testprog)",
                      (void *)0x0);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                      ,L'.',"foo",L'Ƥ',L'\xffffffff',"foo2");
  wVar1 = systemf("%s -rf archive.tar foo",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                      ,L'0',0,"0",(long)wVar1,"systemf(\"%s -rf archive.tar foo\", testprog)",
                      (void *)0x0);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                      ,L'2',"bar",L'Ƥ',L'\xffffffff',"bar1");
  wVar1 = systemf("%s -rf archive.tar bar",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                      ,L'4',0,"0",(long)wVar1,"systemf(\"%s -rf archive.tar bar\", testprog)",
                      (void *)0x0);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                      ,L'6',"foo",L'Ƥ',L'\xffffffff',"foo3");
  wVar1 = systemf("%s -rf archive.tar foo",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                      ,L'8',0,"0",(long)wVar1,"systemf(\"%s -rf archive.tar foo\", testprog)",
                      (void *)0x0);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                      ,L':',"bar",L'Ƥ',L'\xffffffff',"bar2");
  wVar1 = systemf("%s -rf archive.tar bar",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                      ,L'<',0,"0",(long)wVar1,"systemf(\"%s -rf archive.tar bar\", testprog)",
                      (void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                     ,L'D',"test1",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                  ,L'E',"test1");
  wVar1 = systemf("%s -xf ../archive.tar -q foo >test.out 2>test.err",testprog);
  failure("Fatal error trying to use -q option");
  wVar1 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                              ,L'I',0,"0",(long)wVar1,"r",(void *)0x0);
  if (wVar1 != L'\0') {
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'L',"foo1",L'\x04',"foo");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'M',"test.out");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'N',"test.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                    ,L'O',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                       ,L'R',"test2",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                    ,L'S',"test2");
    wVar1 = systemf("%s -xf ../archive.tar -q foo bar >test.out 2>test.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                        ,L'U',0,"0",(long)wVar1,
                        "systemf(\"%s -xf ../archive.tar -q foo bar >test.out 2>test.err\", testprog)"
                        ,(void *)0x0);
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'V',"foo2",L'\x04',"foo");
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'W',"bar1",L'\x04',"bar");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'X',"test.out");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'Y',"test.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                    ,L'Z',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                       ,L']',"test3",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                    ,L'^',"test3");
    wVar1 = systemf("%s -xf ../archive.tar --fast-read foo bar >test.out 2>test.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                        ,L'`',0,"0",(long)wVar1,
                        "systemf(\"%s -xf ../archive.tar --fast-read foo bar >test.out 2>test.err\", testprog)"
                        ,(void *)0x0);
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'a',"foo2",L'\x04',"foo");
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'b',"bar1",L'\x04',"bar");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'c',"test.out");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'd',"test.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                    ,L'e',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                       ,L'h',"test4",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                    ,L'i',"test4");
    wVar1 = systemf("%s -xf ../archive.tar foo bar >test.out 2>test.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                        ,L'k',0,"0",(long)wVar1,
                        "systemf(\"%s -xf ../archive.tar foo bar >test.out 2>test.err\", testprog)",
                        (void *)0x0);
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'l',"foo3",L'\x04',"foo");
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'm',"bar2",L'\x04',"bar");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'n',"test.out");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
               ,L'o',"test.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_q.c"
                    ,L'p',"..");
    return;
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_q)
{
	int r;

	/*
	 * Create an archive with several different versions of the
	 * same files.  By default, the last version will overwrite
	 * any earlier versions.  The -q/--fast-read option will
	 * stop early, so we can verify -q/--fast-read by seeing
	 * which version of each file actually ended up being
	 * extracted.  This also exercises -r mode, since that's
	 * what we use to build up the test archive.
	 */

	assertMakeFile("foo", 0644, "foo1");

	assertEqualInt(0, systemf("%s -cf archive.tar foo", testprog));

	assertMakeFile("foo", 0644, "foo2");

	assertEqualInt(0, systemf("%s -rf archive.tar foo", testprog));

	assertMakeFile("bar", 0644, "bar1");

	assertEqualInt(0, systemf("%s -rf archive.tar bar", testprog));

	assertMakeFile("foo", 0644, "foo3");

	assertEqualInt(0, systemf("%s -rf archive.tar foo", testprog));

	assertMakeFile("bar", 0644, "bar2");

	assertEqualInt(0, systemf("%s -rf archive.tar bar", testprog));

	/*
	 * Now, try extracting from the test archive with various
	 * combinations of -q.
	 */

	/* Test 1: -q foo should only extract the first foo. */
	assertMakeDir("test1", 0755);
	assertChdir("test1");
	r = systemf("%s -xf ../archive.tar -q foo >test.out 2>test.err",
	    testprog);
	failure("Fatal error trying to use -q option");
	if (!assertEqualInt(0, r))
		return;

	assertFileContents("foo1", 4, "foo");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 2: -q foo bar should extract up to the first bar. */
	assertMakeDir("test2", 0755);
	assertChdir("test2");
	assertEqualInt(0,
	    systemf("%s -xf ../archive.tar -q foo bar >test.out 2>test.err", testprog));
	assertFileContents("foo2", 4, "foo");
	assertFileContents("bar1", 4, "bar");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 3: Same as test 2, but use --fast-read spelling. */
	assertMakeDir("test3", 0755);
	assertChdir("test3");
	assertEqualInt(0,
	    systemf("%s -xf ../archive.tar --fast-read foo bar >test.out 2>test.err", testprog));
	assertFileContents("foo2", 4, "foo");
	assertFileContents("bar1", 4, "bar");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 4: Without -q, should extract everything. */
	assertMakeDir("test4", 0755);
	assertChdir("test4");
	assertEqualInt(0,
	    systemf("%s -xf ../archive.tar foo bar >test.out 2>test.err", testprog));
	assertFileContents("foo3", 4, "foo");
	assertFileContents("bar2", 4, "bar");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");
}